

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  element_type *peVar2;
  long in_RDI;
  long in_FS_OFFSET;
  ScopedElement e;
  SectionStats *in_stack_fffffffffffffec8;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  ScopedElement *in_stack_fffffffffffffee0;
  ScopedElement *this_00;
  XmlFormatting fmt;
  undefined4 in_stack_fffffffffffffee8;
  XmlFormatting in_stack_fffffffffffffeec;
  string *in_stack_fffffffffffffef0;
  allocator *paVar3;
  XmlWriter *in_stack_fffffffffffffef8;
  undefined1 local_e0 [2];
  allocator local_de;
  allocator local_dd [20];
  allocator local_c9 [33];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  StreamingReporterBase<Catch::XmlReporter>::sectionEnded
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  iVar1 = *(int *)(in_RDI + 0x1b8) + -1;
  *(int *)(in_RDI + 0x1b8) = iVar1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"OverallResults",local_c9);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"successes",local_dd);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (unsigned_long *)in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)local_dd);
    paVar3 = &local_de;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"failures",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (unsigned_long *)in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_de);
    paVar3 = (allocator *)(local_e0 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"expectedFailures",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (unsigned_long *)in_stack_fffffffffffffed0);
    fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)(local_e0 + 1));
    peVar2 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x256fab);
    iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      this_00 = (ScopedElement *)local_e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"durationInSeconds",(allocator *)this_00);
      XmlWriter::ScopedElement::writeAttribute<double>
                (this_00,in_stack_fffffffffffffed8,(double *)in_stack_fffffffffffffed0);
      fmt = (XmlFormatting)((ulong)this_00 >> 0x20);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)local_e0);
    }
    operator|(Newline,Indent);
    XmlWriter::endElement((XmlWriter *)CONCAT44(iVar1,in_stack_fffffffffffffee8),fmt);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffed0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if( --m_sectionDepth > 0 ) {
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
            e.writeAttribute( "successes", sectionStats.assertions.passed );
            e.writeAttribute( "failures", sectionStats.assertions.failed );
            e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

            m_xml.endElement();
        }
    }